

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
* __thiscall
pstore::json::details::whitespace_matcher<pstore::exchange::import_ns::callbacks>::
consume_comment_start
          (pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
           *__return_storage_ptr__,whitespace_matcher<pstore::exchange::import_ns::callbacks> *this,
          parser<pstore::exchange::import_ns::callbacks> *parser,char c)

{
  undefined3 in_register_00000009;
  error_code local_28;
  
  if (CONCAT31(in_register_00000009,c) == 0x2a) {
    if ((parser->extensions_ & multi_line_comments) != none) {
      (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ = 6;
      goto LAB_0012e92f;
    }
  }
  else if ((CONCAT31(in_register_00000009,c) == 0x2f) &&
          ((parser->extensions_ & single_line_comments) != none)) {
    (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ = 4;
    goto LAB_0012e92f;
  }
  local_28._M_cat = get_error_category();
  local_28._M_value = 8;
  matcher<pstore::exchange::import_ns::callbacks>::set_error
            (&this->super_matcher<pstore::exchange::import_ns::callbacks>,parser,&local_28);
LAB_0012e92f:
  *(undefined8 *)
   &(__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
       = 1;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_false>
  ._M_head_impl = (matcher<pstore::exchange::import_ns::callbacks> *)0x0;
  __return_storage_ptr__->second = true;
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            whitespace_matcher<Callbacks>::consume_comment_start (parser<Callbacks> & parser,
                                                                  char c) {
                using details::char_set;
                if (c == char_set::slash &&
                    parser.extension_enabled (extensions::single_line_comments)) {
                    this->set_state (single_line_comment_state);
                } else if (c == char_set::star &&
                           parser.extension_enabled (extensions::multi_line_comments)) {
                    this->set_state (multi_line_comment_body_state);
                } else {
                    this->set_error (parser, error_code::expected_token);
                }
                return {nullptr, true}; // Consume this character.
            }